

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::emplace<QPropertyAnimation*const&>
          (QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*> *this,
          pair<QObject_*,_QByteArray> *key,QPropertyAnimation **args)

{
  Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> **)
            this;
  if (pDVar1 == (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *
                )0x0) {
    local_28.d = (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
                  *)0x0;
LAB_003acc31:
    pDVar1 = (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *)
             0x0;
LAB_003acc52:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> **)this =
         pDVar1;
LAB_003acc5a:
    pVar2 = (piter)emplace_helper<QPropertyAnimation*const&>(this,key,args);
    QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::~QHash(&local_28);
  }
  else {
    if (1 < *(uint *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                      _vptr_QObject) {
      local_28.d = pDVar1;
      if (*(int *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                   _vptr_QObject != -1) {
        LOCK();
        *(int *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                 _vptr_QObject =
             *(int *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                      _vptr_QObject + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
                   **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
                       *)0x0) goto LAB_003acc31;
      }
      if (1 < *(uint *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).
                        super_QObject._vptr_QObject) goto LAB_003acc52;
      goto LAB_003acc5a;
    }
    if (((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)&pDVar1->size)->d <
        (QObjectData *)(pDVar1->numBuckets >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QPropertyAnimation*const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_003accd9;
    }
    local_28.d = (Data *)*args;
    pVar2 = (piter)emplace_helper<QPropertyAnimation*>(this,key,(QPropertyAnimation **)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_003accd9:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }